

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_togglenetwork::test_method(rpc_togglenetwork *this)

{
  long lVar1;
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  UniValue *pUVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  bool *pbVar4;
  iterator pvVar5;
  int *piVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  string_view key;
  const_string file;
  const_string file_00;
  string_view key_00;
  const_string file_01;
  string_view key_01;
  const_string file_02;
  const_string file_03;
  string_view key_02;
  const_string file_04;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffffc10;
  assertion_result *__a;
  assertion_result *__a_00;
  undefined8 in_stack_fffffffffffffc18;
  char *pcVar9;
  undefined8 in_stack_fffffffffffffc20;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  int numConnection;
  char *local_2b8;
  char *local_2b0;
  assertion_result local_2a8;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  bool netState;
  string local_238 [32];
  string local_218 [32];
  UniValue local_1f8;
  string local_1a0 [32];
  string local_180 [32];
  UniValue local_160;
  string local_108 [32];
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  char *local_d0 [8];
  UniValue r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r.val._M_dataplus._M_p = (pointer)&r.val.field_2;
  r.val._M_string_length = 0;
  r.val.field_2._M_local_buf[0] = '\0';
  r.typ = VNULL;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __a = &local_2a8;
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"getnetworkinfo",(allocator<char> *)__a);
  args._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffc0c;
  args._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffc08;
  args._M_string_length = in_stack_fffffffffffffc10;
  args.field_2._M_allocated_capacity = in_stack_fffffffffffffc18;
  args.field_2._8_8_ = in_stack_fffffffffffffc20;
  RPCTestingSetup::CallRPC((UniValue *)local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  UniValue::operator=(&r,(UniValue *)local_e8);
  UniValue::~UniValue((UniValue *)local_e8);
  std::__cxx11::string::~string(local_108);
  pUVar2 = UniValue::get_obj(&r);
  key._M_str = "networkactive";
  key._M_len = 0xd;
  pUVar2 = UniValue::find_value(pUVar2,key);
  netState = UniValue::get_bool(pUVar2);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xb1;
  file.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_260,msg);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_268 = "";
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  pcVar9 = "true";
  uVar7 = 0xbbc4de;
  uVar8 = 0;
  pvVar3 = (iterator)0x2;
  pbVar4 = &netState;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_e8,&local_270,0xb1,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"setnetworkactive false",(allocator<char> *)local_e8);
  args_00._M_dataplus._M_p._4_4_ = uVar8;
  args_00._M_dataplus._M_p._0_4_ = uVar7;
  args_00._M_string_length = (size_type)__a;
  args_00.field_2._M_allocated_capacity = (size_type)pcVar9;
  args_00.field_2._8_8_ = in_stack_fffffffffffffc20;
  RPCTestingSetup::CallRPC(&local_160,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  UniValue::~UniValue(&local_160);
  std::__cxx11::string::~string(local_180);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pbVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0xb3;
  file_00.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_290,
             msg_00);
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113d350;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = "no exceptions thrown by CallRPC(\"setnetworkactive false\")";
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b0 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar3 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,(lazy_ostream *)local_e8,1,1,WARN,(check_type)__a,(size_t)&local_2b8,0xb3);
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  __a_00 = &local_2a8;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"getnetworkinfo",(allocator<char> *)__a_00);
  args_01._M_dataplus._M_p._4_4_ = uVar8;
  args_01._M_dataplus._M_p._0_4_ = uVar7;
  args_01._M_string_length = (size_type)__a;
  args_01.field_2._M_allocated_capacity = (size_type)pcVar9;
  args_01.field_2._8_8_ = in_stack_fffffffffffffc20;
  RPCTestingSetup::CallRPC((UniValue *)local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  UniValue::operator=(&r,(UniValue *)local_e8);
  UniValue::~UniValue((UniValue *)local_e8);
  std::__cxx11::string::~string(local_1a0);
  pUVar2 = UniValue::get_obj(&r);
  key_00._M_str = "connections";
  key_00._M_len = 0xb;
  pUVar2 = UniValue::find_value(pUVar2,key_00);
  numConnection = UniValue::getInt<int>(pUVar2);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_300;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_310,
             msg_01);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_318 = "";
  local_2a8._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  piVar6 = &numConnection;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_e8,&local_320,0xb6,1,2,piVar6,0xbbc579,__a_00,"0");
  pUVar2 = UniValue::get_obj(&r);
  key_01._M_str = "networkactive";
  key_01._M_len = 0xd;
  pUVar2 = UniValue::find_value(pUVar2,key_01);
  netState = UniValue::get_bool(pUVar2);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)piVar6;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0xb9;
  file_02.m_begin = (iterator)&local_330;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_340,
             msg_02);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_348 = "";
  local_2a8._0_4_ = local_2a8._0_4_ & 0xffffff00;
  pcVar9 = "false";
  uVar7 = 0xbbc4de;
  uVar8 = 0;
  pvVar3 = (iterator)0x2;
  pbVar4 = &netState;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_e8,&local_350,0xb9,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"setnetworkactive true",(allocator<char> *)local_e8);
  args_02._M_dataplus._M_p._4_4_ = uVar8;
  args_02._M_dataplus._M_p._0_4_ = uVar7;
  args_02._M_string_length = (size_type)__a_00;
  args_02.field_2._M_allocated_capacity = (size_type)pcVar9;
  args_02.field_2._8_8_ = in_stack_fffffffffffffc20;
  RPCTestingSetup::CallRPC(&local_1f8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  UniValue::~UniValue(&local_1f8);
  std::__cxx11::string::~string(local_218);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pbVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0xbb;
  file_03.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
             msg_03);
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a170;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = "no exceptions thrown by CallRPC(\"setnetworkactive true\")";
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_378 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar3 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,(lazy_ostream *)local_e8,1,1,WARN,(check_type)__a_00,(size_t)&local_380,0xbb
            );
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"getnetworkinfo",(allocator<char> *)&local_2a8);
  args_03._M_dataplus._M_p._4_4_ = uVar8;
  args_03._M_dataplus._M_p._0_4_ = uVar7;
  args_03._M_string_length = (size_type)__a_00;
  args_03.field_2._M_allocated_capacity = (size_type)pcVar9;
  args_03.field_2._8_8_ = in_stack_fffffffffffffc20;
  RPCTestingSetup::CallRPC((UniValue *)local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  UniValue::operator=(&r,(UniValue *)local_e8);
  UniValue::~UniValue((UniValue *)local_e8);
  std::__cxx11::string::~string(local_238);
  pUVar2 = UniValue::get_obj(&r);
  key_02._M_str = "networkactive";
  key_02._M_len = 0xd;
  pUVar2 = UniValue::find_value(pUVar2,key_02);
  netState = UniValue::get_bool(pUVar2);
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0xbe;
  file_04.m_begin = (iterator)&local_3c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d0,
             msg_04);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_e8,&stack0xfffffffffffffc20,0xbe,1,2,&netState,0xbbc4de,&local_2a8,"true");
  UniValue::~UniValue(&r);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_togglenetwork)
{
    UniValue r;

    r = CallRPC("getnetworkinfo");
    bool netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive false"));
    r = CallRPC("getnetworkinfo");
    int numConnection = r.get_obj().find_value("connections").getInt<int>();
    BOOST_CHECK_EQUAL(numConnection, 0);

    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, false);

    BOOST_CHECK_NO_THROW(CallRPC("setnetworkactive true"));
    r = CallRPC("getnetworkinfo");
    netState = r.get_obj().find_value("networkactive").get_bool();
    BOOST_CHECK_EQUAL(netState, true);
}